

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::ChooseSelectionResult
          (Result<wallet::SelectionResult> *__return_storage_ptr__,Chain *chain,
          CAmount *nTargetValue,Groups *groups,CoinSelectionParams *coin_selection_params)

{
  long lVar1;
  pointer pSVar2;
  T *pTVar3;
  long lVar4;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__x;
  _Rb_tree_node_base *p_Var5;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  _Var6;
  int iVar7;
  int iVar8;
  long lVar9;
  bilingual_str *this;
  pointer this_00;
  long in_FS_OFFSET;
  undefined1 auVar10 [12];
  vector<COutPoint,_std::allocator<COutPoint>_> outpoints;
  anon_class_8_1_53f960a9 append_error;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  errors;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> results;
  Result<wallet::SelectionResult> bnb_result;
  _Vector_base<COutPoint,_std::allocator<COutPoint>_> local_278;
  anon_class_8_1_53f960a9 local_260;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  local_258;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> local_238;
  SelectionResult local_220;
  bilingual_str local_1b0;
  bilingual_str local_170;
  bilingual_str local_130;
  undefined1 local_f0 [112];
  __index_type local_80;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_238.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_start = (SelectionResult *)0x0;
  local_238.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SelectionResult *)0x0;
  local_238.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260.errors = &local_258;
  local_258.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 400000;
  if ((coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged != false) {
    iVar7 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
            _M_payload.super__Optional_payload_base<int>._M_payload._M_value;
  }
  iVar8 = iVar7 + coin_selection_params->tx_noinputs_size * -4;
  if (iVar8 == 0 || iVar7 < coin_selection_params->tx_noinputs_size * 4) {
    _(&local_78,(ConstevalStringLiteral)0x3ffa6d);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_78);
    this = &local_78;
  }
  else {
    if (coin_selection_params->m_subtract_fee_outputs == false) {
      SelectCoinsBnB((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,
                     nTargetValue,&coin_selection_params->m_cost_of_change,iVar8);
      if (local_80 == '\x01') {
        pTVar3 = util::Result<wallet::SelectionResult>::value
                           ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_238,pTVar3);
      }
      else {
        ChooseSelectionResult::anon_class_8_1_53f960a9::operator()
                  (&local_260,(Result<wallet::SelectionResult> *)local_f0);
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
    }
    iVar8 = iVar8 + coin_selection_params->change_output_size * -4;
    if ((iVar8 < 0) &&
       (local_238.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_238.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      _(&local_130,(ConstevalStringLiteral)0x3ffab7);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_130);
      this = &local_130;
    }
    else {
      KnapsackSolver((Result<wallet::SelectionResult> *)local_f0,&groups->mixed_group,nTargetValue,
                     coin_selection_params->m_min_change_target,coin_selection_params->rng_fast,
                     iVar8);
      if (local_80 == '\x01') {
        pTVar3 = util::Result<wallet::SelectionResult>::value
                           ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_238,pTVar3);
      }
      else {
        ChooseSelectionResult::anon_class_8_1_53f960a9::operator()
                  (&local_260,(Result<wallet::SelectionResult> *)local_f0);
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
      lVar9 = (coin_selection_params->m_long_term_feerate).nSatoshisPerK;
      lVar4 = lVar9 * 3;
      lVar1 = (coin_selection_params->m_effective_feerate).nSatoshisPerK;
      if (lVar1 != lVar4 && SBORROW8(lVar1,lVar4) == lVar1 + lVar9 * -3 < 0) {
        CoinGrinder((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,nTargetValue
                    ,coin_selection_params->m_min_change_target,iVar8);
        if (local_80 == '\x01') {
          pTVar3 = util::Result<wallet::SelectionResult>::value
                             ((Result<wallet::SelectionResult> *)local_f0);
          SelectionResult::RecalculateWaste
                    (pTVar3,coin_selection_params->min_viable_change,
                     coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          pTVar3 = util::Result<wallet::SelectionResult>::value
                             ((Result<wallet::SelectionResult> *)local_f0);
          std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                    (&local_238,pTVar3);
        }
        else {
          ChooseSelectionResult::anon_class_8_1_53f960a9::operator()
                    (&local_260,(Result<wallet::SelectionResult> *)local_f0);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_f0);
      }
      SelectCoinsSRD((Result<wallet::SelectionResult> *)local_f0,&groups->positive_group,
                     *nTargetValue,coin_selection_params->m_change_fee,
                     coin_selection_params->rng_fast,iVar8);
      if (local_80 == '\x01') {
        pTVar3 = util::Result<wallet::SelectionResult>::value
                           ((Result<wallet::SelectionResult> *)local_f0);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_238,pTVar3);
      }
      else {
        ChooseSelectionResult::anon_class_8_1_53f960a9::operator()
                  (&local_260,(Result<wallet::SelectionResult> *)local_f0);
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)local_f0)
      ;
      pSVar2 = local_238.
               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_238.
          super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_238.
          super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_00 = local_238.
                  super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (this_00 == pSVar2) {
            _Var6 = std::
                    __min_element<__gnu_cxx::__normal_iterator<wallet::SelectionResult*,std::vector<wallet::SelectionResult,std::allocator<wallet::SelectionResult>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (local_238.
                               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_238.
                               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            SelectionResult::SelectionResult(&local_220,_Var6._M_current);
            std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>
            ::_Variant_storage<1ul,wallet::SelectionResult>
                      ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                       __return_storage_ptr__,&local_220);
            _GLOBAL__N_1::std::
            _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                         *)&local_220);
            break;
          }
          local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __x = &SelectionResult::GetInputSet(this_00)->_M_t;
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)local_f0,__x);
          lVar9 = 0;
          for (p_Var5 = (_Rb_tree_node_base *)local_f0._24_8_;
              p_Var5 != (_Rb_tree_node_base *)(local_f0 + 8);
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            if (*(int *)(*(long *)(p_Var5 + 1) + 0x70) < 1) {
              std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back
                        ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_278,
                         (value_type *)(*(long *)(p_Var5 + 1) + 0x20));
              lVar9 = lVar9 + *(long *)(*(long *)(p_Var5 + 1) + 0x98);
            }
          }
          auVar10 = (**(code **)(*(long *)chain + 0xc0))
                              (chain,&local_278,&coin_selection_params->m_effective_feerate);
          if ((auVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
            _(&local_1b0,(ConstevalStringLiteral)0x3ffb00);
            std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>
            ::_Variant_storage<0ul,bilingual_str>
                      ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                       __return_storage_ptr__,&local_1b0);
            bilingual_str::~bilingual_str(&local_1b0);
          }
          else {
            lVar9 = lVar9 - auVar10._0_8_;
            if (lVar9 != 0) {
              SelectionResult::SetBumpFeeDiscount(this_00,lVar9);
            }
            SelectionResult::RecalculateWaste
                      (this_00,coin_selection_params->min_viable_change,
                       coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          }
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)local_f0);
          std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base(&local_278);
          this_00 = this_00 + 1;
        } while ((auVar10 & (undefined1  [12])0x1) != (undefined1  [12])0x0);
        goto LAB_00214937;
      }
      if (local_258.
          super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_258.
          super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
        _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                        __return_storage_ptr__,
                        (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                        local_258.
                        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_00214937;
      }
      local_170.original._M_dataplus._M_p = (pointer)&local_170.original.field_2;
      local_170.translated._M_string_length = 0;
      local_170.translated.field_2._8_8_ = 0;
      local_170.original.field_2._M_allocated_capacity = 0;
      local_170.original.field_2._8_8_ = 0;
      local_170.original._M_string_length = 0;
      local_170.translated._M_dataplus._M_p = (pointer)&local_170.translated.field_2;
      local_170.translated.field_2._M_allocated_capacity = 0;
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_170);
      this = &local_170;
    }
  }
  bilingual_str::~bilingual_str(this);
LAB_00214937:
  std::
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ::~vector(&local_258);
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::~vector
            (&local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> ChooseSelectionResult(interfaces::Chain& chain, const CAmount& nTargetValue, Groups& groups, const CoinSelectionParams& coin_selection_params)
{
    // Vector of results. We will choose the best one based on waste.
    std::vector<SelectionResult> results;
    std::vector<util::Result<SelectionResult>> errors;
    auto append_error = [&] (util::Result<SelectionResult>&& result) {
        // If any specific error message appears here, then something different from a simple "no selection found" happened.
        // Let's save it, so it can be retrieved to the user if no other selection algorithm succeeded.
        if (HasErrorMsg(result)) {
            errors.emplace_back(std::move(result));
        }
    };

    // Maximum allowed weight for selected coins.
    int max_transaction_weight = coin_selection_params.m_max_tx_weight.value_or(MAX_STANDARD_TX_WEIGHT);
    int tx_weight_no_input = coin_selection_params.tx_noinputs_size * WITNESS_SCALE_FACTOR;
    int max_selection_weight = max_transaction_weight - tx_weight_no_input;
    if (max_selection_weight <= 0) {
        return util::Error{_("Maximum transaction weight is less than transaction weight without inputs")};
    }

    // SFFO frequently causes issues in the context of changeless input sets: skip BnB when SFFO is active
    if (!coin_selection_params.m_subtract_fee_outputs) {
        if (auto bnb_result{SelectCoinsBnB(groups.positive_group, nTargetValue, coin_selection_params.m_cost_of_change, max_selection_weight)}) {
            results.push_back(*bnb_result);
        } else append_error(std::move(bnb_result));
    }

    // Deduct change weight because remaining Coin Selection algorithms can create change output
    int change_outputs_weight = coin_selection_params.change_output_size * WITNESS_SCALE_FACTOR;
    max_selection_weight -= change_outputs_weight;
    if (max_selection_weight < 0 && results.empty()) {
        return util::Error{_("Maximum transaction weight is too low, can not accommodate change output")};
    }

    // The knapsack solver has some legacy behavior where it will spend dust outputs. We retain this behavior, so don't filter for positive only here.
    if (auto knapsack_result{KnapsackSolver(groups.mixed_group, nTargetValue, coin_selection_params.m_min_change_target, coin_selection_params.rng_fast, max_selection_weight)}) {
        results.push_back(*knapsack_result);
    } else append_error(std::move(knapsack_result));

    if (coin_selection_params.m_effective_feerate > CFeeRate{3 * coin_selection_params.m_long_term_feerate}) { // Minimize input set for feerates of at least 3×LTFRE (default: 30 ṩ/vB+)
        if (auto cg_result{CoinGrinder(groups.positive_group, nTargetValue, coin_selection_params.m_min_change_target, max_selection_weight)}) {
            cg_result->RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
            results.push_back(*cg_result);
        } else {
            append_error(std::move(cg_result));
        }
    }

    if (auto srd_result{SelectCoinsSRD(groups.positive_group, nTargetValue, coin_selection_params.m_change_fee, coin_selection_params.rng_fast, max_selection_weight)}) {
        results.push_back(*srd_result);
    } else append_error(std::move(srd_result));

    if (results.empty()) {
        // No solution found, retrieve the first explicit error (if any).
        // future: add 'severity level' to errors so the worst one can be retrieved instead of the first one.
        return errors.empty() ? util::Error() : std::move(errors.front());
    }

    // If the chosen input set has unconfirmed inputs, check for synergies from overlapping ancestry
    for (auto& result : results) {
        std::vector<COutPoint> outpoints;
        std::set<std::shared_ptr<COutput>> coins = result.GetInputSet();
        CAmount summed_bump_fees = 0;
        for (auto& coin : coins) {
            if (coin->depth > 0) continue; // Bump fees only exist for unconfirmed inputs
            outpoints.push_back(coin->outpoint);
            summed_bump_fees += coin->ancestor_bump_fees;
        }
        std::optional<CAmount> combined_bump_fee = chain.calculateCombinedBumpFee(outpoints, coin_selection_params.m_effective_feerate);
        if (!combined_bump_fee.has_value()) {
            return util::Error{_("Failed to calculate bump fees, because unconfirmed UTXOs depend on enormous cluster of unconfirmed transactions.")};
        }
        CAmount bump_fee_overestimate = summed_bump_fees - combined_bump_fee.value();
        if (bump_fee_overestimate) {
            result.SetBumpFeeDiscount(bump_fee_overestimate);
        }
        result.RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
    }

    // Choose the result with the least waste
    // If the waste is the same, choose the one which spends more inputs.
    return *std::min_element(results.begin(), results.end());
}